

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::validateAlignment
          (FunctionValidator *this,size_t align,Type type,Index bytes,bool isAtomic,Expression *curr
          )

{
  bool bVar1;
  BasicType BVar2;
  char *__assertion;
  undefined7 in_register_00000081;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ValidationInfo *local_40;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  if ((int)CONCAT71(in_register_00000081,isAtomic) != 0) {
    shouldBeEqual<wasm::Expression*,unsigned_long>
              (this,align,(ulong)bytes,curr,"atomic accesses must have natural alignment");
    return;
  }
  if ((0x10 < align) || ((0x10116UL >> (align & 0x3f) & 1) == 0)) {
    local_40 = this->info;
    std::__cxx11::to_string(&local_80,align);
    std::operator+(&local_60,"bad alignment: ",&local_80);
    ValidationInfo::fail<wasm::Expression*,std::__cxx11::string>
              (local_40,&local_60,curr,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  shouldBeTrue<wasm::Expression*>(this,align <= bytes,curr,"alignment must not exceed natural");
  bVar1 = wasm::Type::isTuple(&local_38);
  if (bVar1) {
    __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_00a40237:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                  ,0xc3e,
                  "void wasm::FunctionValidator::validateAlignment(size_t, Type, Index, bool, Expression *)"
                 );
  }
  if (6 < local_38.id) {
    __assertion = "type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00a40237;
  }
  BVar2 = wasm::Type::getBasic(&local_38);
  switch(BVar2) {
  case none:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                       ,0xc4e);
  default:
    goto switchD_00a40197_caseD_1;
  case i32:
  case f32:
    bVar1 = align < 5;
    break;
  case i64:
  case f64:
    bVar1 = align < 9;
  }
  shouldBeTrue<wasm::Expression*>(this,bVar1,curr,"alignment must not exceed natural");
switchD_00a40197_caseD_1:
  return;
}

Assistant:

void FunctionValidator::validateAlignment(
  size_t align, Type type, Index bytes, bool isAtomic, Expression* curr) {
  if (isAtomic) {
    shouldBeEqual(align,
                  (size_t)bytes,
                  curr,
                  "atomic accesses must have natural alignment");
    return;
  }
  switch (align) {
    case 1:
    case 2:
    case 4:
    case 8:
    case 16:
      break;
    default: {
      info.fail("bad alignment: " + std::to_string(align), curr, getFunction());
      break;
    }
  }
  shouldBeTrue(align <= bytes, curr, "alignment must not exceed natural");
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    case Type::i32:
    case Type::f32: {
      shouldBeTrue(align <= 4, curr, "alignment must not exceed natural");
      break;
    }
    case Type::i64:
    case Type::f64: {
      shouldBeTrue(align <= 8, curr, "alignment must not exceed natural");
      break;
    }
    case Type::v128:
    case Type::unreachable:
      break;
    case Type::none:
      WASM_UNREACHABLE("invalid type");
  }
}